

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O2

int Ses_StoreTimesEqual(int *pTimes1,int *pTimes2,int nVars)

{
  int *piVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  uVar4 = (ulong)(uint)nVars;
  if (nVars < 1) {
    uVar4 = uVar3;
  }
  do {
    if (uVar4 == uVar3) {
      return 1;
    }
    piVar1 = pTimes1 + uVar3;
    piVar2 = pTimes2 + uVar3;
    uVar3 = uVar3 + 1;
  } while (*piVar1 == *piVar2);
  return 0;
}

Assistant:

static inline int Ses_StoreTimesEqual( int * pTimes1, int * pTimes2, int nVars )
{
    int i;
    for ( i = 0; i < nVars; ++i )
        if ( pTimes1[i] != pTimes2[i] )
            return 0;
    return 1;
}